

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration absl::lts_20250127::Ceil(Duration d,Duration unit)

{
  uint32_t uVar1;
  uint32_t uVar2;
  HiRep HVar3;
  HiRep HVar4;
  Duration rhs;
  Duration local_30;
  
  uVar1 = unit.rep_lo_;
  HVar3 = unit.rep_hi_;
  local_30 = Trunc(d,unit);
  if (local_30.rep_hi_ == d.rep_hi_) {
    if (d.rep_lo_ <= local_30.rep_lo_) {
      return local_30;
    }
  }
  else if ((long)d.rep_hi_ <= (long)local_30.rep_hi_) {
    return local_30;
  }
  uVar2 = uVar1;
  if (HVar3 == (HiRep)0x0) {
    HVar4.lo_ = 0;
    HVar4.hi_ = 0;
  }
  else {
    HVar4 = HVar3;
    if ((long)HVar3 < 0) {
      uVar2 = 0xffffffff;
      HVar4.lo_ = 0xffffffff;
      HVar4.hi_ = 0x7fffffff;
      if (uVar1 != 0xffffffff) {
        if (uVar1 == 0) {
          HVar4 = (HiRep)-(long)HVar3;
          uVar2 = 0;
        }
        else {
          HVar4 = (HiRep)~(ulong)HVar3;
          uVar2 = 4000000000 - uVar1;
        }
      }
    }
  }
  rhs.rep_lo_ = uVar2;
  rhs.rep_hi_ = HVar4;
  Duration::operator+=(&local_30,rhs);
  return local_30;
}

Assistant:

Duration Ceil(const Duration d, const Duration unit) {
  const absl::Duration td = Trunc(d, unit);
  return td >= d ? td : td + AbsDuration(unit);
}